

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O3

int x509_store_add(X509_STORE *ctx,void *x,int is_crl)

{
  CRYPTO_MUTEX *lock;
  OPENSSL_STACK *sk;
  int iVar1;
  size_t in_RAX;
  X509_OBJECT *a;
  size_t sVar2;
  X509_OBJECT *a_00;
  size_t i;
  size_t sVar3;
  size_t idx;
  size_t local_38;
  
  if (x == (void *)0x0) {
    return 0;
  }
  local_38 = in_RAX;
  a = (X509_OBJECT *)OPENSSL_zalloc(0x10);
  if (a == (X509_OBJECT *)0x0) {
    return 0;
  }
  a->type = 2 - (uint)(is_crl == 0);
  (a->data).ptr = (char *)x;
  X509_OBJECT_up_ref_count(a);
  lock = &ctx->objs_lock;
  CRYPTO_MUTEX_lock_write(lock);
  sk = (OPENSSL_STACK *)ctx->objs;
  OPENSSL_sk_sort(sk,sk_X509_OBJECT_call_cmp_func);
  iVar1 = OPENSSL_sk_find(sk,&local_38,a,sk_X509_OBJECT_call_cmp_func);
  if (iVar1 != 0) {
    sVar3 = local_38;
    if (a->type - 1U < 2) {
      for (; sVar2 = OPENSSL_sk_num(sk), sVar3 < sVar2; sVar3 = sVar3 + 1) {
        a_00 = (X509_OBJECT *)OPENSSL_sk_value(sk,sVar3);
        iVar1 = x509_object_cmp(a_00,(X509_OBJECT *)a);
        if (iVar1 != 0) break;
        if (a->type == 2) {
          iVar1 = X509_CRL_match((X509_CRL *)(a_00->data).x509,(a->data).crl);
        }
        else {
          if (a->type != 1) goto LAB_00199e4c;
          iVar1 = X509_cmp((X509 *)(a_00->data).x509,(a->data).x509);
        }
        if (iVar1 == 0) goto LAB_00199e51;
      }
    }
    else {
      a_00 = (X509_OBJECT *)OPENSSL_sk_value(sk,local_38);
LAB_00199e4c:
      if (a_00 != (X509_OBJECT *)0x0) {
LAB_00199e51:
        CRYPTO_MUTEX_unlock_write(lock);
        iVar1 = 1;
        goto LAB_00199e82;
      }
    }
  }
  sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)ctx->objs,a);
  CRYPTO_MUTEX_unlock_write(lock);
  if (sVar3 != 0) {
    return 1;
  }
  iVar1 = 0;
LAB_00199e82:
  X509_OBJECT_free_contents(a);
  OPENSSL_free(a);
  return iVar1;
}

Assistant:

static int x509_store_add(X509_STORE *ctx, void *x, int is_crl) {
  if (x == NULL) {
    return 0;
  }

  X509_OBJECT *const obj = X509_OBJECT_new();
  if (obj == NULL) {
    return 0;
  }

  if (is_crl) {
    obj->type = X509_LU_CRL;
    obj->data.crl = (X509_CRL *)x;
  } else {
    obj->type = X509_LU_X509;
    obj->data.x509 = (X509 *)x;
  }
  X509_OBJECT_up_ref_count(obj);

  CRYPTO_MUTEX_lock_write(&ctx->objs_lock);

  int ret = 1;
  int added = 0;
  // Duplicates are silently ignored
  if (!X509_OBJECT_retrieve_match(ctx->objs, obj)) {
    ret = added = (sk_X509_OBJECT_push(ctx->objs, obj) != 0);
  }

  CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);

  if (!added) {
    X509_OBJECT_free(obj);
  }

  return ret;
}